

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

__pid_t __thiscall cimg_library::cimg::wait(cimg *this,void *__stat_loc)

{
  time_t tVar1;
  ulong uVar2;
  cimg *__timer;
  uint time_diff;
  unsigned_long current_time;
  unsigned_long *p_timer_local;
  uint milliseconds_local;
  
  __timer = this;
  if (*__stat_loc == 0) {
    tVar1 = time((time_t *)this);
    *(time_t *)__stat_loc = tVar1;
  }
  uVar2 = time((time_t *)__timer);
  if (uVar2 < *__stat_loc + ((ulong)this & 0xffffffff)) {
    p_timer_local._4_4_ = ((int)*__stat_loc + (int)this) - (int)uVar2;
    *(ulong *)__stat_loc = uVar2 + p_timer_local._4_4_;
    sleep(p_timer_local._4_4_);
  }
  else {
    *(ulong *)__stat_loc = uVar2;
    p_timer_local._4_4_ = 0;
  }
  return p_timer_local._4_4_;
}

Assistant:

inline unsigned int wait(const unsigned int milliseconds, cimg_ulong *const p_timer) {
      if (!*p_timer) *p_timer = cimg::time();
      const cimg_ulong current_time = cimg::time();
      if (current_time>=*p_timer + milliseconds) { *p_timer = current_time; return 0; }
      const unsigned int time_diff = (unsigned int)(*p_timer + milliseconds - current_time);
      *p_timer = current_time + time_diff;
      cimg::sleep(time_diff);
      return time_diff;
    }